

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O0

void Abc_NtkGetSeqPoSupp(Abc_Ntk_t *pNtk,int iFrame,int iNumPo)

{
  int iVar1;
  int iVar2;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *p;
  Abc_Obj_t *pAVar3;
  int local_40;
  int local_3c;
  int k;
  int i;
  Vec_Ptr_t *vSupp;
  Abc_Obj_t *pNodePo;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pFrames;
  int iNumPo_local;
  int iFrame_local;
  Abc_Ntk_t *pNtk_local;
  
  pFrames._0_4_ = iNumPo;
  pFrames._4_4_ = iFrame;
  _iNumPo_local = pNtk;
  pNtk_00 = Abc_NtkFrames(pNtk,iFrame + 1,0,0);
  iVar2 = pFrames._4_4_;
  pObj = (Abc_Obj_t *)pNtk_00;
  iVar1 = Abc_NtkPoNum(_iNumPo_local);
  vSupp = (Vec_Ptr_t *)Abc_NtkPo(pNtk_00,iVar2 * iVar1 + (int)pFrames);
  p = Abc_NtkNodeSupport((Abc_Ntk_t *)pObj,(Abc_Obj_t **)&vSupp,1);
  for (local_3c = 0; iVar2 = Abc_NtkCiNum((Abc_Ntk_t *)pObj), local_3c < iVar2;
      local_3c = local_3c + 1) {
    pNodePo = Abc_NtkCi((Abc_Ntk_t *)pObj,local_3c);
    (pNodePo->field_6).pTemp = (void *)0x0;
  }
  for (local_3c = 0; iVar2 = Vec_PtrSize(p), local_3c < iVar2; local_3c = local_3c + 1) {
    pNodePo = (Abc_Obj_t *)Vec_PtrEntry(p,local_3c);
    pNodePo->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
  }
  for (local_3c = 0; iVar2 = Abc_NtkCiNum(_iNumPo_local), local_3c < iVar2; local_3c = local_3c + 1)
  {
    pNodePo = Abc_NtkCi(_iNumPo_local,local_3c);
    (pNodePo->field_6).pTemp = (void *)0x0;
  }
  for (local_3c = 0; iVar2 = Vec_PtrSize(_iNumPo_local->vBoxes), local_3c < iVar2;
      local_3c = local_3c + 1) {
    pNodePo = Abc_NtkBox(_iNumPo_local,local_3c);
    iVar2 = Abc_ObjIsLatch(pNodePo);
    if ((iVar2 != 0) &&
       (pAVar3 = Abc_NtkBox((Abc_Ntk_t *)pObj,local_3c), (pAVar3->field_6).pTemp != (void *)0x0)) {
      pNodePo->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
    }
  }
  for (local_3c = 0; iVar2 = Abc_NtkPiNum(_iNumPo_local), local_3c < iVar2; local_3c = local_3c + 1)
  {
    pNodePo = Abc_NtkPi(_iNumPo_local,local_3c);
    for (local_40 = 0; pAVar3 = pObj, local_40 <= pFrames._4_4_; local_40 = local_40 + 1) {
      iVar2 = Abc_NtkPiNum(_iNumPo_local);
      pAVar3 = Abc_NtkPi((Abc_Ntk_t *)pAVar3,local_40 * iVar2 + local_3c);
      if ((pAVar3->field_6).pTemp != (void *)0x0) {
        pNodePo->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
      }
    }
  }
  Vec_PtrFree(p);
  Abc_NtkDelete((Abc_Ntk_t *)pObj);
  return;
}

Assistant:

void Abc_NtkGetSeqPoSupp( Abc_Ntk_t * pNtk, int iFrame, int iNumPo )
{
    Abc_Ntk_t * pFrames;
    Abc_Obj_t * pObj, * pNodePo;
    Vec_Ptr_t * vSupp;
    int i, k;
    // get the timeframes of the network
    pFrames = Abc_NtkFrames( pNtk, iFrame + 1, 0, 0 );
//Abc_NtkShowAig( pFrames );

    // get the PO of the timeframes
    pNodePo = Abc_NtkPo( pFrames, iFrame * Abc_NtkPoNum(pNtk) + iNumPo );
    // set the support
    vSupp   = Abc_NtkNodeSupport( pFrames, &pNodePo, 1 );
    // mark the support of the frames
    Abc_NtkForEachCi( pFrames, pObj, i )
        pObj->pCopy = NULL;
    Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)1;
    // mark the support of the network if the support of the timeframes is marked
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = NULL;
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_NtkBox(pFrames, i)->pCopy )
            pObj->pCopy = (Abc_Obj_t *)1;
    Abc_NtkForEachPi( pNtk, pObj, i )
        for ( k = 0; k <= iFrame; k++ )
            if ( Abc_NtkPi(pFrames, k*Abc_NtkPiNum(pNtk) + i)->pCopy )
                pObj->pCopy = (Abc_Obj_t *)1;
    // free stuff
    Vec_PtrFree( vSupp );
    Abc_NtkDelete( pFrames );
}